

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O2

void m2v_multadd_row(m2v *M1,int r1,int alpha,m2v *Mt,int rt)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  if (alpha != 0) {
    iVar1 = M1->row_stride;
    iVar4 = Mt->row_stride;
    iVar3 = rt * iVar4;
    for (lVar2 = 0; lVar2 < iVar4; lVar2 = lVar2 + 1) {
      Mt->e[iVar3 + lVar2] = Mt->e[iVar3 + lVar2] ^ M1->e[r1 * iVar1 + lVar2];
      iVar4 = Mt->row_stride;
    }
  }
  return;
}

Assistant:

void m2v_multadd_row(const m2v* M1,
			int r1,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	const int o1 = get_word(M1, r1, 0);
	const int ot = get_word(Mt, rt, 0);
	for (int i = 0; i < Mt->row_stride; ++i) {
		Mt->e[ot + i] ^= M1->e[o1 + i];
	}
}